

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_option_opts_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  ostream *poVar4;
  reference ppOVar5;
  string local_4f8;
  Option *local_4d8;
  Option *op_1;
  iterator __end3_1;
  iterator __begin3_1;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *__range3_1;
  string local_480;
  string local_460;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> local_440;
  string local_410;
  Option *local_3f0;
  Option *op;
  iterator __end3;
  iterator __begin3;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *__range3;
  string local_398;
  string local_378;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> local_358;
  string local_328;
  allocator<char> local_301;
  string local_300;
  string local_2e0;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream out;
  Option *opt_local;
  Formatter *this_local;
  
  out._384_8_ = opt;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  psVar3 = Option::get_option_text_abi_cxx11_((Option *)out._384_8_);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (psVar3);
  if (bVar1) {
    iVar2 = Option::get_type_size((Option *)out._384_8_);
    if (iVar2 != 0) {
      Option::get_type_name_abi_cxx11_(&local_1d8,(Option *)out._384_8_);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        (&local_1d8);
      ::std::__cxx11::string::~string((string *)&local_1d8);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        poVar4 = ::std::operator<<((ostream *)&out.field_0x8," ");
        Option::get_type_name_abi_cxx11_(&local_218,(Option *)out._384_8_);
        FormatterBase::get_label(&local_1f8,&this->super_FormatterBase,&local_218);
        ::std::operator<<(poVar4,(string *)&local_1f8);
        ::std::__cxx11::string::~string((string *)&local_1f8);
        ::std::__cxx11::string::~string((string *)&local_218);
      }
      Option::get_default_str_abi_cxx11_(&local_238,(Option *)out._384_8_);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        (&local_238);
      ::std::__cxx11::string::~string((string *)&local_238);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        poVar4 = ::std::operator<<((ostream *)&out.field_0x8," [");
        Option::get_default_str_abi_cxx11_(&local_258,(Option *)out._384_8_);
        poVar4 = ::std::operator<<(poVar4,(string *)&local_258);
        ::std::operator<<(poVar4,"] ");
        ::std::__cxx11::string::~string((string *)&local_258);
      }
      iVar2 = Option::get_expected_max((Option *)out._384_8_);
      if (iVar2 == 0x20000000) {
        ::std::operator<<((ostream *)&out.field_0x8," ...");
      }
      else {
        iVar2 = Option::get_expected_min((Option *)out._384_8_);
        if (1 < iVar2) {
          poVar4 = ::std::operator<<((ostream *)&out.field_0x8," x ");
          iVar2 = Option::get_expected((Option *)out._384_8_);
          ::std::ostream::operator<<(poVar4,iVar2);
        }
      }
      bVar1 = OptionBase<CLI::Option>::get_required((OptionBase<CLI::Option> *)out._384_8_);
      if (bVar1) {
        poVar4 = ::std::operator<<((ostream *)&out.field_0x8," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_298,"REQUIRED",&local_299);
        FormatterBase::get_label(&local_278,&this->super_FormatterBase,&local_298);
        ::std::operator<<(poVar4,(string *)&local_278);
        ::std::__cxx11::string::~string((string *)&local_278);
        ::std::__cxx11::string::~string((string *)&local_298);
        ::std::allocator<char>::~allocator(&local_299);
      }
    }
    Option::get_envname_abi_cxx11_(&local_2c0,(Option *)out._384_8_);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (&local_2c0);
    ::std::__cxx11::string::~string((string *)&local_2c0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar4 = ::std::operator<<((ostream *)&out.field_0x8," (");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"Env",&local_301);
      FormatterBase::get_label(&local_2e0,&this->super_FormatterBase,&local_300);
      poVar4 = ::std::operator<<(poVar4,(string *)&local_2e0);
      poVar4 = ::std::operator<<(poVar4,":");
      Option::get_envname_abi_cxx11_(&local_328,(Option *)out._384_8_);
      poVar4 = ::std::operator<<(poVar4,(string *)&local_328);
      ::std::operator<<(poVar4,")");
      ::std::__cxx11::string::~string((string *)&local_328);
      ::std::__cxx11::string::~string((string *)&local_2e0);
      ::std::__cxx11::string::~string((string *)&local_300);
      ::std::allocator<char>::~allocator(&local_301);
    }
    Option::get_needs(&local_358,(Option *)out._384_8_);
    bVar1 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::empty
                      (&local_358);
    std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::~set
              (&local_358);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar4 = ::std::operator<<((ostream *)&out.field_0x8," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,"Needs",(allocator<char> *)((long)&__range3 + 7));
      FormatterBase::get_label(&local_378,&this->super_FormatterBase,&local_398);
      poVar4 = ::std::operator<<(poVar4,(string *)&local_378);
      ::std::operator<<(poVar4,":");
      ::std::__cxx11::string::~string((string *)&local_378);
      ::std::__cxx11::string::~string((string *)&local_398);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
      Option::get_needs((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                         *)&__begin3,(Option *)out._384_8_);
      __end3 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::
               begin((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *
                     )&__begin3);
      op = (Option *)
           std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::end
                     ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                       *)&__begin3);
      while (bVar1 = std::operator==(&__end3,(_Self *)&op), ((bVar1 ^ 0xffU) & 1) != 0) {
        ppOVar5 = std::_Rb_tree_const_iterator<CLI::Option_*>::operator*(&__end3);
        local_3f0 = *ppOVar5;
        poVar4 = ::std::operator<<((ostream *)&out.field_0x8," ");
        Option::get_name_abi_cxx11_(&local_410,local_3f0,false,false);
        ::std::operator<<(poVar4,(string *)&local_410);
        ::std::__cxx11::string::~string((string *)&local_410);
        std::_Rb_tree_const_iterator<CLI::Option_*>::operator++(&__end3);
      }
      std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::~set
                ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
                 &__begin3);
    }
    Option::get_excludes(&local_440,(Option *)out._384_8_);
    bVar1 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::empty
                      (&local_440);
    std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::~set
              (&local_440);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar4 = ::std::operator<<((ostream *)&out.field_0x8," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_480,"Excludes",(allocator<char> *)((long)&__range3_1 + 7));
      FormatterBase::get_label(&local_460,&this->super_FormatterBase,&local_480);
      poVar4 = ::std::operator<<(poVar4,(string *)&local_460);
      ::std::operator<<(poVar4,":");
      ::std::__cxx11::string::~string((string *)&local_460);
      ::std::__cxx11::string::~string((string *)&local_480);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range3_1 + 7));
      Option::get_excludes
                ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
                 &__begin3_1,(Option *)out._384_8_);
      __end3_1 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::
                 begin((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                        *)&__begin3_1);
      op_1 = (Option *)
             std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::end
                       ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                         *)&__begin3_1);
      while (bVar1 = std::operator==(&__end3_1,(_Self *)&op_1), ((bVar1 ^ 0xffU) & 1) != 0) {
        ppOVar5 = std::_Rb_tree_const_iterator<CLI::Option_*>::operator*(&__end3_1);
        local_4d8 = *ppOVar5;
        poVar4 = ::std::operator<<((ostream *)&out.field_0x8," ");
        Option::get_name_abi_cxx11_(&local_4f8,local_4d8,false,false);
        ::std::operator<<(poVar4,(string *)&local_4f8);
        ::std::__cxx11::string::~string((string *)&local_4f8);
        std::_Rb_tree_const_iterator<CLI::Option_*>::operator++(&__end3_1);
      }
      std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::~set
                ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
                 &__begin3_1);
    }
  }
  else {
    poVar4 = ::std::operator<<((ostream *)&out.field_0x8," ");
    psVar3 = Option::get_option_text_abi_cxx11_((Option *)out._384_8_);
    ::std::operator<<(poVar4,(string *)psVar3);
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_option_opts(const Option *opt) const {
    std::stringstream out;

    if(!opt->get_option_text().empty()) {
        out << " " << opt->get_option_text();
    } else {
        if(opt->get_type_size() != 0) {
            if(!opt->get_type_name().empty())
                out << " " << get_label(opt->get_type_name());
            if(!opt->get_default_str().empty())
                out << " [" << opt->get_default_str() << "] ";
            if(opt->get_expected_max() == detail::expected_max_vector_size)
                out << " ...";
            else if(opt->get_expected_min() > 1)
                out << " x " << opt->get_expected();

            if(opt->get_required())
                out << " " << get_label("REQUIRED");
        }
        if(!opt->get_envname().empty())
            out << " (" << get_label("Env") << ":" << opt->get_envname() << ")";
        if(!opt->get_needs().empty()) {
            out << " " << get_label("Needs") << ":";
            for(const Option *op : opt->get_needs())
                out << " " << op->get_name();
        }
        if(!opt->get_excludes().empty()) {
            out << " " << get_label("Excludes") << ":";
            for(const Option *op : opt->get_excludes())
                out << " " << op->get_name();
        }
    }
    return out.str();
}